

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q9.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  string str1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string str2;
  
  get_args_abi_cxx11_(&args,argc,argv);
  if ((long)args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x60) {
    std::__cxx11::string::string
              ((string *)&str1,
               (string *)
               (args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1));
    std::__cxx11::string::string
              ((string *)&str2,
               (string *)
               (args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 2));
    bVar1 = rotation(&str1,&str2);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&str1);
      pcVar3 = " is a rotation of ";
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&str1);
      pcVar3 = " is not a rotation of ";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,(string *)&str2);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&str2);
    std::__cxx11::string::~string((string *)&str1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  return 0;
}

Assistant:

int main(int argc, char** argv){
  auto args {get_args(argc, argv)};

  if (args.size() == 3){
    std::string str1 {args[1]};
    std::string str2 {args[2]};

    if (rotation(str1, str2)){
      std::cout << str1 << " is a rotation of " << str2 << '\n';
    }
    else{
      std::cout << str1 << " is not a rotation of " << str2 << '\n';
    }
  }

  return 0;
}